

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::ParseName(Lexer *this)

{
  char *ptr;
  bool bVar1;
  char cVar2;
  int iVar3;
  Lexer *pLVar4;
  char *ptr_00;
  size_t sVar5;
  string_view name;
  string_view name_00;
  
  ptr_00 = this->m_current;
  cVar2 = *ptr_00;
  pLVar4 = this;
  if (cVar2 == '\'') {
    AdvanceCurrent(this);
    ptr_00 = this->m_current;
  }
  bVar1 = IsNameStart(pLVar4,ptr_00);
  if (!bVar1) {
    Error<>(this,"Invalid character in name");
  }
  while( true ) {
    pLVar4 = this;
    AdvanceCurrent(this);
    ptr = this->m_current;
    if ((*ptr == '\0') || (this->m_end < ptr)) break;
    if (cVar2 == '\'') {
      if (*ptr == '\'') {
        sVar5 = (long)ptr - (long)ptr_00;
LAB_001c8856:
        AdvanceCurrent(this);
        name_00._M_str = ptr_00;
        name_00._M_len = sVar5;
        CreateSymbol(this,name_00);
        cVar2 = *this->m_current;
LAB_001c8872:
        iVar3 = tolower((int)cVar2);
        if (iVar3 != 0x73) {
          return;
        }
        AdvanceCurrent(this);
        return;
      }
    }
    else {
      bVar1 = IsName(pLVar4,ptr);
      if (!bVar1) {
        sVar5 = (long)ptr - (long)ptr_00;
        goto LAB_001c8821;
      }
    }
  }
  sVar5 = (long)ptr - (long)ptr_00;
  if (cVar2 == '\'') goto LAB_001c8856;
LAB_001c8821:
  name._M_str = ptr_00;
  name._M_len = sVar5;
  CreateSymbol(this,name);
  cVar2 = *this->m_current;
  if (cVar2 == '\'') {
    AdvanceCurrent(this);
    cVar2 = *this->m_current;
    if (cVar2 == '\0') {
      return;
    }
    if (this->m_end < this->m_current) {
      return;
    }
  }
  goto LAB_001c8872;
}

Assistant:

inline_t void Lexer::ParseName()
	{
		bool quotedName = false;
		if (*m_current == '\'')
		{
			quotedName = true;
			AdvanceCurrent();
		}

		const char * startName = m_current;

		if (!IsNameStart(m_current))
			Error("Invalid character in name");
		AdvanceCurrent();

		// Advance until we reach the end of the text or hit a non-name character
		while (!IsEndOfText())
		{
			if (quotedName)
			{
				if (*m_current == '\'')
					break;
			}
			else
			{
				if (!IsName(m_current))
					break;
			}
			AdvanceCurrent();
		}
		size_t count = m_current - startName;
		if (quotedName)
			AdvanceCurrent();
		CreateSymbol(std::string_view(startName, count));

		// Check for apostrophe-s.  If the name is quoted, no additional quote is needed
		if (!quotedName)
		{
			if (*m_current == '\'')
			{
				AdvanceCurrent();
				if (IsEndOfText())
					return;
			}
		}
		if (std::tolower(*m_current) == 's')
			AdvanceCurrent();
	}